

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O3

void __thiscall
MaterialSystemTest_testFloatProperty_Test::TestBody(MaterialSystemTest_testFloatProperty_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  float pf;
  Message local_50;
  AssertHelper local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  ai_real local_2c;
  
  local_2c = 150392.62;
  aiMaterial::AddBinaryProperty
            ((this->super_MaterialSystemTest).pcMat,&local_2c,4,"testKey1",0,0,aiPTI_Float);
  local_2c = 0.0;
  local_50.ss_.ptr_._0_4_ = 0;
  local_48.data_._0_4_ =
       aiGetMaterialFloatArray
                 ((this->super_MaterialSystemTest).pcMat,"testKey1",0,0,&local_2c,(uint *)0x0);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            (local_40,"aiReturn_SUCCESS","pcMat->Get(\"testKey1\",0,0,pf)",(aiReturn *)&local_50,
             (aiReturn *)&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message(&local_50);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50.ss_.ptr_._0_4_ = 0x4812de28;
  testing::internal::CmpHelperEQ<float,float>
            (local_40,"150392.63f","pf",(float *)&local_50,&local_2c);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message(&local_50);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testFloatProperty)
{
    float pf = 150392.63f;
    this->pcMat->AddProperty(&pf,1,"testKey1");
    pf = 0.0f;

    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey1",0,0,pf));
    EXPECT_EQ(150392.63f, pf);
}